

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msvc_objectmodel.cpp
# Opt level: O0

void __thiscall VCPostBuildEventTool::VCPostBuildEventTool(VCPostBuildEventTool *this)

{
  VCEventTool *in_RDI;
  long in_FS_OFFSET;
  char *in_stack_00000008;
  QString *eventName;
  QString local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  eventName = &local_20;
  QString::QString((QString *)in_RDI,in_stack_00000008);
  VCEventTool::VCEventTool(in_RDI,eventName);
  QString::~QString((QString *)0x272231);
  (in_RDI->super_VCToolBase)._vptr_VCToolBase = (_func_int **)&PTR__VCPostBuildEventTool_003ba8a0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

VCPostBuildEventTool::VCPostBuildEventTool()
    : VCEventTool("PostBuildEvent")
{
}